

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementFormControl.cpp
# Opt level: O1

void __thiscall
Rml::ElementFormControl::OnAttributeChange
          (ElementFormControl *this,ElementAttributes *changed_attributes)

{
  bool activate;
  const_iterator cVar1;
  undefined1 local_68 [40];
  undefined8 local_40;
  PropertyDefinition *local_38;
  int local_30;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  Element::OnAttributeChange(&this->super_Element,changed_attributes);
  cVar1 = itlib::
          flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::find<char[9]>(changed_attributes,(char (*) [9])"disabled");
  if (cVar1._M_current !=
      (changed_attributes->m_container).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    activate = IsDisabled(this);
    local_68._0_8_ = local_68 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"disabled","");
    Element::SetPseudoClass(&this->super_Element,(String *)local_68,activate);
    if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if (activate) {
      local_68._0_8_ = (pointer)0x2d;
      Variant::Set((Variant *)local_68,0);
      local_40._0_4_ = KEYWORD;
      local_40._4_4_ = -1;
      local_38 = (PropertyDefinition *)0x0;
      local_30 = -1;
      local_28 = (element_type *)0x0;
      _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Element::SetProperty(&this->super_Element,Focus,(Property *)local_68);
      if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
      }
      Variant::~Variant((Variant *)local_68);
      Element::Blur(&this->super_Element);
    }
    else {
      Element::RemoveProperty(&this->super_Element,Focus);
    }
  }
  return;
}

Assistant:

void ElementFormControl::OnAttributeChange(const ElementAttributes& changed_attributes)
{
	Element::OnAttributeChange(changed_attributes);

	if (changed_attributes.find("disabled") != changed_attributes.end())
	{
		bool is_disabled = IsDisabled();
		SetPseudoClass("disabled", is_disabled);

		// Disable focus when element is disabled. This will also prevent click
		// events (when originating from user inputs, see Context) to reach the element.
		if (is_disabled)
		{
			SetProperty(PropertyId::Focus, Property(Style::Focus::None));
			Blur();
		}
		else
			RemoveProperty(PropertyId::Focus);
	}
}